

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O2

void soul::SanityCheckPass::RecursiveGraphDetector::check(Graph *g,RecursiveGraphDetector *stack)

{
  pointer ppVar1;
  RecursiveGraphDetector *pRVar2;
  ProcessorRef *pPVar3;
  QualifiedIdentifier *this;
  Graph *pGVar4;
  pointer ppVar5;
  pool_ptr<soul::AST::Graph> sub;
  pool_ptr<soul::AST::QualifiedIdentifier> name;
  pool_ptr<soul::AST::ProcessorRef> pr;
  RecursiveGraphDetector newStack;
  vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
  modulesFound;
  pool_ptr<soul::AST::Graph> local_160;
  long local_158;
  pool_ref<soul::AST::ModuleBase> local_150;
  Graph *local_148;
  pool_ptr<soul::AST::Expression> local_140;
  pool_ptr<soul::AST::Expression> local_138;
  long local_130;
  RecursiveGraphDetector local_128;
  IdentifierPath local_118;
  CompileMessage local_c0;
  ArrayWithPreallocation<soul::Identifier,_8UL> local_88;
  
  for (pRVar2 = stack; pRVar2 != (RecursiveGraphDetector *)0x0; pRVar2 = pRVar2->previous) {
    if (pRVar2->graph == g) {
      (*(g->super_ProcessorBase).super_ModuleBase.super_ASTObject._vptr_ASTObject[0xd])
                (&local_118,g);
      Errors::recursiveTypes<soul::IdentifierPath>(&local_c0,&local_118);
      AST::Context::throwError
                (&(g->super_ProcessorBase).super_ModuleBase.super_ASTObject.context,&local_c0,false)
      ;
    }
  }
  ppVar5 = (g->processorInstances).
           super__Vector_base<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (g->processorInstances).
           super__Vector_base<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_128.previous = stack;
  local_128.graph = g;
  while( true ) {
    if (ppVar5 == ppVar1) {
      return;
    }
    local_160.object = (Graph *)0x0;
    local_138.object = (ppVar5->object->targetProcessor).object;
    cast<soul::AST::ProcessorRef,soul::AST::Expression>((soul *)&local_130,&local_138);
    if (local_130 == 0) {
      local_140.object = (ppVar5->object->targetProcessor).object;
      cast<soul::AST::QualifiedIdentifier,soul::AST::Expression>((soul *)&local_158,&local_140);
      if (local_158 == 0) {
        pGVar4 = (Graph *)0x0;
      }
      else {
        this = pool_ptr<soul::AST::QualifiedIdentifier>::operator->
                         ((pool_ptr<soul::AST::QualifiedIdentifier> *)&local_158);
        AST::QualifiedIdentifier::getPath((IdentifierPath *)&local_88,this);
        AST::Scope::getMatchingSubModules
                  ((vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                    *)&local_118,&(g->super_ProcessorBase).super_ModuleBase.super_Scope,
                   (IdentifierPath *)&local_88);
        ArrayWithPreallocation<soul::Identifier,_8UL>::clear(&local_88);
        if (local_118.pathSections.numActive - (long)local_118.pathSections.items == 8) {
          local_150.object =
               (ModuleBase *)
               (((ProcessorBase *)&(local_118.pathSections.items)->name)->super_ModuleBase).
               super_ASTObject._vptr_ASTObject;
          cast<soul::AST::Graph,soul::AST::ModuleBase>((soul *)&local_148,&local_150);
          local_160.object = local_148;
          pGVar4 = local_148;
        }
        else {
          pGVar4 = (Graph *)0x0;
        }
        std::
        _Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
        ::~_Vector_base((_Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                         *)&local_118);
      }
    }
    else {
      pPVar3 = pool_ptr<soul::AST::ProcessorRef>::operator->
                         ((pool_ptr<soul::AST::ProcessorRef> *)&local_130);
      cast<soul::AST::Graph,soul::AST::ProcessorBase>((soul *)&local_118,pPVar3->processor);
      local_160.object = (Graph *)local_118.pathSections.items;
      pGVar4 = (Graph *)local_118.pathSections.items;
    }
    if (pGVar4 != (Graph *)0x0) break;
    ppVar5 = ppVar5 + 1;
  }
  pGVar4 = pool_ptr<soul::AST::Graph>::operator*(&local_160);
  check(pGVar4,&local_128);
  return;
}

Assistant:

static void check (AST::Graph& g, const RecursiveGraphDetector* stack = nullptr)
        {
            for (auto s = stack; s != nullptr; s = s->previous)
                if (s->graph == std::addressof (g))
                    g.context.throwError (Errors::recursiveTypes (g.getFullyQualifiedPath()));

            const RecursiveGraphDetector newStack { stack, std::addressof (g) };

            for (auto& p : g.processorInstances)
            {
                // avoid using findSingleMatchingSubModule() as we don't want an error thrown if
                // a processor specialisation alias has not yet been resolved

                pool_ptr<AST::Graph> sub;

                if (auto pr = cast<AST::ProcessorRef> (p->targetProcessor))
                {
                    sub = cast<AST::Graph> (pr->processor);
                }
                else if (auto name = cast<AST::QualifiedIdentifier> (p->targetProcessor))
                {
                    auto modulesFound = g.getMatchingSubModules (name->getPath());

                    if (modulesFound.size() == 1)
                        sub = cast<AST::Graph> (modulesFound.front());
                }

                if (sub != nullptr)
                    return check (*sub, std::addressof (newStack));
            }
        }